

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int analyze_miniscript(char *miniscript,char **key_name_array,char **key_value_array,
                      size_t array_len,uint32_t target,uint32_t *network,uint32_t flags,
                      miniscript_node_t *prev_node,miniscript_node_t *parent_node,
                      miniscript_node_t **generate_node,char **script_ignore_checksum)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  miniscript_item_t *pmVar5;
  char *pcVar6;
  size_t max;
  size_t table_idx;
  size_t len;
  miniscript_wrapper_item_t *item;
  miniscript_node_t *prev_child;
  miniscript_node_t *child;
  miniscript_node_t *node;
  size_t checksum_index;
  size_t checksum_len;
  char work_checksum [12];
  char checksum [12];
  char buffer [64];
  int local_8c;
  _Bool copy_child;
  _Bool exist_indent;
  _Bool collect_child;
  size_t sStack_88;
  uint32_t indent;
  size_t child_offset;
  size_t offset;
  size_t sub_str_len;
  size_t str_len;
  size_t index;
  char *sub_str;
  uint32_t *puStack_50;
  int ret;
  uint32_t *network_local;
  size_t sStack_40;
  uint32_t target_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *miniscript_local;
  
  sub_str._4_4_ = 0;
  index = 0;
  offset = 0;
  child_offset = 0;
  sStack_88 = 0;
  local_8c = 0;
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  checksum_index = 0;
  node = (miniscript_node_t *)0x0;
  prev_child = (miniscript_node_t *)0x0;
  item = (miniscript_wrapper_item_t *)0x0;
  puStack_50 = network;
  network_local._4_4_ = target;
  sStack_40 = array_len;
  array_len_local = (size_t)key_value_array;
  key_value_array_local = key_name_array;
  key_name_array_local = (char **)miniscript;
  sub_str_len = strlen(miniscript);
  child = (miniscript_node_t *)wally_malloc(0x80);
  if (child == (miniscript_node_t *)0x0) {
    miniscript_local._4_4_ = -3;
  }
  else {
    wally_bzero(child,0x80);
    wally_bzero(checksum + 4,0x40);
    wally_bzero(work_checksum + 4,0xc);
    wally_bzero(&checksum_len,0xc);
    if (parent_node != (miniscript_node_t *)0x0) {
      child->parent = parent_node;
    }
    for (str_len = 0; str_len < sub_str_len; str_len = str_len + 1) {
      if ((child->info == (miniscript_item_t *)0x0) &&
         (*(char *)((long)key_name_array_local + str_len) == ':')) {
        if (0xc < str_len - child_offset) {
          sub_str._4_4_ = -2;
          break;
        }
        memcpy(child->wrapper_str,(void *)((long)key_name_array_local + child_offset),
               str_len - child_offset);
        child_offset = str_len + 1;
      }
      else if (*(char *)((long)key_name_array_local + str_len) == '(') {
        if ((child->info == (miniscript_item_t *)0x0) && (local_8c == 0)) {
          bVar1 = true;
          memcpy(checksum + 4,(void *)((long)key_name_array_local + child_offset),
                 str_len - child_offset);
          pmVar5 = search_miniscript_info(checksum + 4,network_local._4_4_);
          child->info = pmVar5;
          if (child->info == (miniscript_item_t *)0x0) {
            sub_str._4_4_ = -2;
            break;
          }
          if ((child->wrapper_str[0] != '\0') && ((child->info->kind & 1U) == 0)) {
            sub_str._4_4_ = -2;
            break;
          }
          sStack_88 = str_len + 1;
          child_offset = sStack_88;
        }
        local_8c = local_8c + 1;
        bVar3 = true;
      }
      else if (*(char *)((long)key_name_array_local + str_len) == ')') {
        if (((local_8c != 0) && (local_8c = local_8c + -1, bVar1)) && (local_8c == 0)) {
          bVar1 = false;
          child_offset = str_len + 1;
          bVar2 = true;
        }
        bVar3 = true;
      }
      else if (*(char *)((long)key_name_array_local + str_len) == ',') {
        if ((bVar1) && (local_8c == 1)) {
          bVar2 = true;
        }
        bVar3 = true;
      }
      else if ((((*(char *)((long)key_name_array_local + str_len) == '#') &&
                (parent_node == (miniscript_node_t *)0x0)) &&
               (child->info != (miniscript_item_t *)0x0)) && ((!bVar1 && (local_8c == 0)))) {
        node = (miniscript_node_t *)str_len;
        checksum_index = strlen((char *)((long)key_name_array_local + str_len + 1));
        if (checksum_index < 0xc) {
          memcpy(work_checksum + 4,(void *)((long)key_name_array_local + str_len + 1),checksum_index
                );
        }
        else {
          sub_str._4_4_ = -2;
        }
        break;
      }
      if (bVar2) {
        sub_str._4_4_ = realloc_substr_buffer(str_len - sStack_88,(char **)&index,&offset);
        if (sub_str._4_4_ != 0) break;
        memcpy((void *)index,(void *)((long)key_name_array_local + sStack_88),str_len - sStack_88);
        *(undefined1 *)(index + (str_len - sStack_88)) = 0;
        sub_str._4_4_ =
             analyze_miniscript((char *)index,key_value_array_local,(char **)array_len_local,
                                sStack_40,network_local._4_4_,puStack_50,flags,
                                (miniscript_node_t *)item,child,&prev_child,(char **)0x0);
        if (sub_str._4_4_ != 0) break;
        item = (miniscript_wrapper_item_t *)prev_child;
        prev_child = (miniscript_node_t *)0x0;
        bVar2 = false;
        if (*(char *)((long)key_name_array_local + str_len) == ',') {
          sStack_88 = str_len + 1;
          child_offset = sStack_88;
        }
      }
    }
    if ((sub_str._4_4_ == 0) && (!bVar3)) {
      sub_str._4_4_ =
           analyze_miniscript_value
                     ((char *)key_name_array_local,key_value_array_local,(char **)array_len_local,
                      sStack_40,puStack_50,flags,child,parent_node);
    }
    if ((((sub_str._4_4_ == 0) && (child->info != (miniscript_item_t *)0x0)) &&
        ((child->info->kind & 1U) != 0)) && (child->wrapper_str[0] != '\0')) {
      uVar4 = convert_miniscript_wrapper_flag(child->wrapper_str);
      child->wrapper = uVar4;
    }
    if (((sub_str._4_4_ == 0) && (child->info != (miniscript_item_t *)0x0)) &&
       (child->info->verify_function != (wally_verify_descriptor_t)0x0)) {
      sub_str._4_4_ = (*child->info->verify_function)(child,parent_node);
    }
    if (((sub_str._4_4_ == 0) && (parent_node == (miniscript_node_t *)0x0)) &&
       ((node != (miniscript_node_t *)0x0 &&
        (sub_str._4_4_ =
              realloc_substr_buffer((size_t)((long)&node->info + 1),(char **)&index,&offset),
        sub_str._4_4_ == 0)))) {
      memcpy((void *)index,key_name_array_local,(size_t)node);
      node->wrapper_str[index - 0x2c] = '\0';
      if (script_ignore_checksum != (char **)0x0) {
        pcVar6 = wally_strdup((char *)index);
        *script_ignore_checksum = pcVar6;
      }
      sub_str._4_4_ = generate_descriptor_checksum((char *)index,(char *)&checksum_len);
      if ((sub_str._4_4_ == 0) && (work_checksum._4_8_ != checksum_len)) {
        sub_str._4_4_ = -2;
      }
    }
    if (((sub_str._4_4_ == 0) && (parent_node == (miniscript_node_t *)0x0)) &&
       (script_ignore_checksum != (char **)0x0)) {
      if (node == (miniscript_node_t *)0x0) {
        pcVar6 = wally_strdup((char *)key_name_array_local);
        *script_ignore_checksum = pcVar6;
      }
      if (*script_ignore_checksum == (char *)0x0) {
        sub_str._4_4_ = -3;
      }
    }
    if ((sub_str._4_4_ == 0) && (child->wrapper != 0)) {
      for (str_len = strlen(child->wrapper_str); str_len != 0; str_len = str_len - 1) {
        len = 0;
        for (max = 0; max < 10; max = max + 1) {
          if (*miniscript_wrapper_table[max].name == child->wrapper_str[str_len - 1]) {
            len = (size_t)(miniscript_wrapper_table + max);
            break;
          }
        }
        if (len == 0) {
          sub_str._4_4_ = -2;
          break;
        }
        sub_str._4_4_ = (**(code **)(len + 0x18))(child,0);
        if (sub_str._4_4_ != 0) break;
      }
      if (sub_str._4_4_ == 0) {
        sub_str._4_4_ = check_type_properties(child->type_properties);
      }
    }
    if (sub_str._4_4_ == 0) {
      *generate_node = child;
      if ((parent_node != (miniscript_node_t *)0x0) &&
         (parent_node->child == (miniscript_node_t *)0x0)) {
        parent_node->child = child;
      }
      if (prev_node == (miniscript_node_t *)0x0) {
        child->chain_count = 1;
      }
      else {
        child->chain_count = prev_node->chain_count + 1;
        child->back = prev_node;
        prev_node->next = child;
      }
    }
    else {
      free_miniscript_node(child);
    }
    if (index != 0) {
      wally_bzero((void *)index,offset);
    }
    wally_free((void *)index);
    miniscript_local._4_4_ = sub_str._4_4_;
  }
  return miniscript_local._4_4_;
}

Assistant:

static int analyze_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t target,
    uint32_t *network,
    uint32_t flags,
    struct miniscript_node_t *prev_node,
    struct miniscript_node_t *parent_node,
    struct miniscript_node_t **generate_node,
    char **script_ignore_checksum)
{
    int ret = WALLY_OK;
    char *sub_str = NULL;
    size_t index;
    size_t str_len;
    size_t sub_str_len = 0;
    size_t offset = 0;
    size_t child_offset = 0;
    uint32_t indent = 0;
    bool collect_child = false;
    bool exist_indent = false;
    bool copy_child = false;
    char buffer[64];
    char checksum[12];
    char work_checksum[12];
    size_t checksum_len = 0;
    size_t checksum_index = 0;
    struct miniscript_node_t *node;
    struct miniscript_node_t *child = NULL;
    struct miniscript_node_t *prev_child = NULL;

    str_len = strlen(miniscript);

    node = (struct miniscript_node_t *) wally_malloc(sizeof(struct miniscript_node_t));
    if (!node)
        return WALLY_ENOMEM;

    wally_bzero(node, sizeof(struct miniscript_node_t));
    wally_bzero(buffer, sizeof(buffer));
    wally_bzero(checksum, sizeof(checksum));
    wally_bzero(work_checksum, sizeof(work_checksum));
    if (parent_node)
        node->parent = parent_node;

    for (index = 0; index < str_len; ++index) {
        if (!node->info && (miniscript[index] == ':')) {
            if (index - offset > sizeof(node->wrapper_str)) {
                ret = WALLY_EINVAL;
                break;
            }
            memcpy(node->wrapper_str, &miniscript[offset], index - offset);
            offset = index + 1;
        } else if (miniscript[index] == '(') {
            if (!node->info && (indent == 0)) {
                collect_child = true;
                memcpy(buffer, &miniscript[offset], index - offset);
                node->info = search_miniscript_info(buffer, target);
                if (!node->info) {
                    ret = WALLY_EINVAL;
                    break;
                } else if ((node->wrapper_str[0] != '\0') &&
                           ((node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) == 0)) {
                    ret = WALLY_EINVAL;
                    break;
                }
                offset = index + 1;
                child_offset = offset;
            }
            ++indent;
            exist_indent = true;
        } else if (miniscript[index] == ')') {
            if (indent) {
                --indent;
                if (collect_child && (indent == 0)) {
                    collect_child = false;
                    offset = index + 1;
                    copy_child = true;
                }
            }
            exist_indent = true;
        } else if (miniscript[index] == ',') {
            if (collect_child && (indent == 1)) {
                copy_child = true;
            }
            exist_indent = true;
        } else if (miniscript[index] == '#') {
            if (!parent_node && node->info && !collect_child && (indent == 0)) {
                checksum_index = index;
                checksum_len = strlen(&miniscript[index + 1]);
                if (sizeof(checksum) > checksum_len) {
                    memcpy(checksum, &miniscript[index + 1], checksum_len);
                } else {
                    ret = WALLY_EINVAL;
                }
                break;  /* end */
            }
        }

        if (copy_child) {
            ret = realloc_substr_buffer(index - child_offset, &sub_str, &sub_str_len);
            if (ret != WALLY_OK)
                break;

            memcpy(sub_str, &miniscript[child_offset], index - child_offset);
            sub_str[index - child_offset] = '\0';
            ret = analyze_miniscript(sub_str,
                                     key_name_array,
                                     key_value_array,
                                     array_len,
                                     target,
                                     network,
                                     flags,
                                     prev_child,
                                     node,
                                     &child,
                                     NULL);
            if (ret != WALLY_OK)
                break;

            prev_child = child;
            child = NULL;
            copy_child = false;
            if (miniscript[index] == ',') {
                offset = index + 1;
                child_offset = offset;
            }
        }
    }

    if ((ret == WALLY_OK) && !exist_indent)
        ret = analyze_miniscript_value(miniscript,
                                       key_name_array,
                                       key_value_array,
                                       array_len,
                                       network,
                                       flags,
                                       node,
                                       parent_node);

    if ((ret == WALLY_OK) && node->info && (node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) &&
        (node->wrapper_str[0] != '\0')) {
        node->wrapper = convert_miniscript_wrapper_flag(node->wrapper_str);
    }

    if ((ret == WALLY_OK) && node->info && node->info->verify_function)
        ret = node->info->verify_function(node, parent_node);

    if ((ret == WALLY_OK) && !parent_node && checksum_index) {
        /* check checksum */
        ret = realloc_substr_buffer(checksum_index + 1, &sub_str, &sub_str_len);
        if (ret == WALLY_OK) {
            memcpy(sub_str, miniscript, checksum_index);
            sub_str[checksum_index] = '\0';
            if (script_ignore_checksum)
                *script_ignore_checksum = wally_strdup(sub_str);

            ret = generate_descriptor_checksum(sub_str, work_checksum);
            if ((ret == WALLY_OK) && (memcmp(checksum, work_checksum, DESCRIPTOR_CHECKSUM_LENGTH) != 0)) {
                ret = WALLY_EINVAL;
            }
        }
    }
    if ((ret == WALLY_OK) && !parent_node && script_ignore_checksum) {
        if (!checksum_index)
            *script_ignore_checksum = wally_strdup(miniscript);

        if (*script_ignore_checksum == NULL)
            ret = WALLY_ENOMEM;
    }

    if ((ret == WALLY_OK) && node->wrapper) {
        const struct miniscript_wrapper_item_t *item = NULL;
        size_t len;
        size_t table_idx;
        size_t max;
        /* back from wrapper string */
        max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
        len = strlen(node->wrapper_str);
        for (index = len; index > 0; --index) {
            item = NULL;
            for (table_idx = 0; table_idx < max; ++table_idx) {
                if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                    item = &miniscript_wrapper_table[table_idx];
                    break;
                }
            }
            if (!item) {
                ret = WALLY_EINVAL;
                break;
            }

            ret = item->verify_function(node, NULL);
            if (ret != WALLY_OK)
                break;
        }
        if (ret == WALLY_OK)
            ret = check_type_properties(node->type_properties);
    }

    if (ret == WALLY_OK) {
        *generate_node = node;
        if (parent_node && !parent_node->child)
            parent_node->child = node;
        if (prev_node) {
            node->chain_count = prev_node->chain_count + 1;
            node->back = prev_node;
            prev_node->next = node;
        } else {
            node->chain_count = 1;
        }
    } else {
        free_miniscript_node(node);
    }

    if (sub_str)
        wally_bzero(sub_str, sub_str_len);
    wally_free(sub_str);
    return ret;
}